

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::usub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  ulong __n;
  APInt AVar2;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  local_30 = RHS->BitWidth;
  if ((ulong)local_30 < 0x41) {
    local_38 = RHS->U;
  }
  else {
    __n = (ulong)((uint)((ulong)local_30 + 0x3f >> 3) & 0xfffffff8);
    local_38.pVal = (uint64_t *)operator_new__(__n);
    memcpy(local_38.pVal,(RHS->U).pVal,__n);
  }
  operator-=((APInt *)&local_38,(APInt *)Overflow);
  this->BitWidth = local_30;
  this->U = local_38;
  local_30 = 0;
  iVar1 = compare(this,RHS);
  *(bool *)in_RCX = 0 < iVar1;
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::usub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this-RHS;
  Overflow = Res.ugt(*this);
  return Res;
}